

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O3

void __thiscall
nonstd::span_lite::detail::contract_violation::contract_violation
          (contract_violation *this,char *message)

{
  allocator local_31;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  std::__cxx11::string::string((string *)local_30,message,&local_31);
  std::logic_error::logic_error(&this->super_logic_error,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  *(undefined ***)this = &PTR__logic_error_001b6c70;
  return;
}

Assistant:

explicit contract_violation( char const * const message )
        : std::logic_error( message )
    {}